

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O0

char * __thiscall
icu_63::KeywordEnumeration::next(KeywordEnumeration *this,int32_t *resultLength,UErrorCode *status)

{
  UBool UVar1;
  size_t sVar2;
  char *pcStack_28;
  int32_t len;
  char *result;
  UErrorCode *status_local;
  int32_t *resultLength_local;
  KeywordEnumeration *this_local;
  
  UVar1 = ::U_SUCCESS(*status);
  if ((UVar1 == '\0') || (*this->current == '\0')) {
    if (resultLength != (int32_t *)0x0) {
      *resultLength = 0;
    }
    pcStack_28 = (char *)0x0;
  }
  else {
    pcStack_28 = this->current;
    sVar2 = strlen(this->current);
    this->current = this->current + ((int)sVar2 + 1);
    if (resultLength != (int32_t *)0x0) {
      *resultLength = (int)sVar2;
    }
  }
  return pcStack_28;
}

Assistant:

virtual const char* next(int32_t* resultLength, UErrorCode& status) {
        const char* result;
        int32_t len;
        if(U_SUCCESS(status) && *current != 0) {
            result = current;
            len = (int32_t)uprv_strlen(current);
            current += len+1;
            if(resultLength != NULL) {
                *resultLength = len;
            }
        } else {
            if(resultLength != NULL) {
                *resultLength = 0;
            }
            result = NULL;
        }
        return result;
    }